

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_color nk_rgba(int r,int g,int b,int a)

{
  int iVar1;
  uint uVar2;
  
  if (0xfe < r) {
    r = 0xff;
  }
  uVar2 = 0;
  if (r < 1) {
    r = uVar2;
  }
  if (0xfe < g) {
    g = 0xff;
  }
  if (g < 1) {
    g = uVar2;
  }
  if (0xfe < b) {
    b = 0xff;
  }
  if (b < 1) {
    b = uVar2;
  }
  iVar1 = 0xff;
  if (a < 0xff) {
    iVar1 = a;
  }
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  return (nk_color)(iVar1 << 0x18 | b << 0x10 | g << 8 | r);
}

Assistant:

NK_API struct nk_color
nk_rgba(int r, int g, int b, int a)
{
    struct nk_color ret;
    ret.r = (nk_byte)NK_CLAMP(0, r, 255);
    ret.g = (nk_byte)NK_CLAMP(0, g, 255);
    ret.b = (nk_byte)NK_CLAMP(0, b, 255);
    ret.a = (nk_byte)NK_CLAMP(0, a, 255);
    return ret;
}